

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O3

UBool ultag_isUnicodeLocaleType_63(char *s,int32_t len)

{
  UBool UVar1;
  bool bVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  if (len < 0) {
    sVar3 = strlen(s);
    len = (int32_t)sVar3;
  }
  iVar4 = 0;
  if (len < 1) {
LAB_002e283c:
    bVar2 = false;
  }
  else {
    iVar5 = len + 1;
    do {
      if (*s == '-') {
        if (iVar4 < 3) {
          return '\0';
        }
        iVar4 = 0;
      }
      else {
        UVar1 = uprv_isASCIILetter_63(*s);
        if (UVar1 == '\0') {
          if ((byte)(*s - 0x3aU) < 0xf6) {
            return '\0';
          }
          if (7 < iVar4) {
            return '\0';
          }
        }
        else if (7 < iVar4) goto LAB_002e283c;
        iVar4 = iVar4 + 1;
      }
      s = s + 1;
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
    bVar2 = 2 < iVar4;
  }
  return bVar2;
}

Assistant:

U_CFUNC UBool
ultag_isUnicodeLocaleType(const char*s, int32_t len) {
    const char* p;
    int32_t subtagLen = 0;

    if (len < 0) {
        len = (int32_t)uprv_strlen(s);
    }

    for (p = s; len > 0; p++, len--) {
        if (*p == SEP) {
            if (subtagLen < 3) {
                return FALSE;
            }
            subtagLen = 0;
        } else if (ISALPHA(*p) || ISNUMERIC(*p)) {
            subtagLen++;
            if (subtagLen > 8) {
                return FALSE;
            }
        } else {
            return FALSE;
        }
    }

    return (subtagLen >= 3);
}